

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_attr_declare(exr_context_t ctxt,int part_index,char *name,exr_attribute_type_t type,
                exr_attribute_t **outattr)

{
  int in_ESI;
  char *in_RDI;
  int32_t unaff_retaddr;
  exr_attribute_type_t unaff_retaddr_00;
  exr_priv_part_t part;
  exr_attribute_list_t *in_stack_00000010;
  exr_result_t rv;
  undefined4 in_stack_00000030;
  exr_const_context_t in_stack_ffffffffffffffc0;
  exr_const_context_t c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar1;
  
  if (in_RDI == (char *)0x0) {
    eVar1 = 2;
  }
  else {
    internal_exr_lock(in_stack_ffffffffffffffc0);
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      internal_exr_unlock(in_stack_ffffffffffffffc0);
      eVar1 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      c = *(exr_const_context_t *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if ((*in_RDI == '\x01') || (*in_RDI == '\x04')) {
        eVar1 = exr_attr_list_add((exr_context_t)outattr,in_stack_00000010,(char *)part,
                                  unaff_retaddr_00,unaff_retaddr,
                                  (uint8_t **)
                                  CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                  (exr_attribute_t **)CONCAT44(part_index,in_stack_00000030));
        internal_exr_unlock(c);
      }
      else {
        internal_exr_unlock(c);
        eVar1 = (**(code **)(in_RDI + 0x38))(in_RDI,8);
      }
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_declare (
    exr_context_t        ctxt,
    int                  part_index,
    const char*          name,
    exr_attribute_type_t type,
    exr_attribute_t**    outattr)
{
    exr_result_t rv;
    EXR_LOCK_AND_DEFINE_PART (part_index);

    if (ctxt->mode != EXR_CONTEXT_WRITE && ctxt->mode != EXR_CONTEXT_TEMPORARY)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));

    rv = exr_attr_list_add (
        ctxt, &(part->attributes), name, type, 0, NULL, outattr);
    return EXR_UNLOCK_AND_RETURN (rv);
}